

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1ToType2Converter.cpp
# Opt level: O0

EStatusCode __thiscall
Type1ToType2Converter::Type1Vstem(Type1ToType2Converter *this,LongList *inOperandList)

{
  long inExtent;
  size_type sVar1;
  Trace *this_00;
  reference plVar2;
  long origin;
  long extent;
  const_reverse_iterator it;
  LongList *inOperandList_local;
  Type1ToType2Converter *this_local;
  
  it.current._M_node = (_List_const_iterator<long>)(_List_const_iterator<long>)inOperandList;
  sVar1 = std::__cxx11::list<long,_std::allocator<long>_>::size(inOperandList);
  if (sVar1 < 2) {
    this_00 = Trace::DefaultTrace();
    sVar1 = std::__cxx11::list<long,_std::allocator<long>_>::size
                      ((list<long,_std::allocator<long>_> *)it.current._M_node);
    Trace::TraceToLog(this_00,
                      "Type1ToType2Converter::Type1Vstem, vestem expecting 2 arguments, got %d. aborting."
                      ,sVar1);
    this_local._4_4_ = eFailure;
  }
  else {
    std::__cxx11::list<long,_std::allocator<long>_>::rbegin
              ((list<long,_std::allocator<long>_> *)&extent);
    plVar2 = std::reverse_iterator<std::_List_const_iterator<long>_>::operator*
                       ((reverse_iterator<std::_List_const_iterator<long>_> *)&extent);
    inExtent = *plVar2;
    std::reverse_iterator<std::_List_const_iterator<long>_>::operator++
              ((reverse_iterator<std::_List_const_iterator<long>_> *)&extent);
    plVar2 = std::reverse_iterator<std::_List_const_iterator<long>_>::operator*
                       ((reverse_iterator<std::_List_const_iterator<long>_> *)&extent);
    AddVStem(this,*plVar2,inExtent);
    if ((this->mFirstPathConstructionEncountered & 1U) != 0) {
      this->mHintAdditionEncountered = true;
    }
    this_local._4_4_ = RecordOperatorWithParameters(this,3,(LongList *)it.current._M_node);
  }
  return this_local._4_4_;
}

Assistant:

EStatusCode Type1ToType2Converter::Type1Vstem(const LongList& inOperandList)
{
	if(inOperandList.size() < 2) {
		TRACE_LOG1("Type1ToType2Converter::Type1Vstem, vestem expecting 2 arguments, got %d. aborting.", inOperandList.size());
		return eFailure;
	}
		
	LongList::const_reverse_iterator it = inOperandList.rbegin();

	long extent = *it;
	++it;
	long origin = *it;
	AddVStem(origin,extent);
	if(mFirstPathConstructionEncountered)
		mHintAdditionEncountered = true;
	return RecordOperatorWithParameters(3,inOperandList);
}